

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark.cpp
# Opt level: O2

void onConnect(int fd)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Task callback;
  undefined1 local_d8 [8];
  string msg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [16];
  _Any_data local_88;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_78;
  code *pcStack_70;
  undefined1 local_68 [24];
  Ptr buff;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  code *local_38;
  code *local_30;
  Task local_28;
  Ptr sc;
  
  puts("onConnect");
  local_d8 = (undefined1  [8])&msg._M_string_length;
  std::__cxx11::string::_M_construct((ulong)local_d8,(char)packetSize);
  hwnet::Buffer::New((Buffer *)(local_68 + 0x10),(string *)local_d8);
  hwnet::TCPSocket::New((TCPSocket *)&stack0xffffffffffffffd8,&poller_,fd);
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = onDataClient;
  pcStack_70 = std::
               _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
               ::_M_invoke;
  local_78._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
       ::_M_manager;
  hwnet::TCPSocket::SetRecvCallback((TCPSocket *)local_68,(RecvCallback *)local_28._vptr_Task);
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)onError;
  local_30 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>
             ::_M_manager;
  hwnet::TCPSocket::SetErrorCallback
            ((TCPSocket *)((long)&msg.field_2 + 8),(ErrorCallback *)local_68._0_8_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff50);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  callback._vptr_Task = local_28._vptr_Task;
  std::__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)
             &buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10));
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_40._M_pi;
  _Var1 = buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_88._M_unused._0_8_ = _Var1._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_88._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_70 = std::
               _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/benmark.cpp:97:23)>
               ::_M_invoke;
  local_78._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/benmark.cpp:97:23)>
       ::_M_manager;
  hwnet::TCPSocket::SetFlushCallback
            ((TCPSocket *)&stack0xffffffffffffff58,(FlushCallback *)callback._vptr_Task);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  hwnet::TCPSocket::Start((TCPSocket *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  hwnet::TCPSocket::Send((TCPSocket *)local_28._vptr_Task,(Ptr *)(local_68 + 0x10),0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sc);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&buff);
  std::__cxx11::string::~string((string *)local_d8);
  return;
}

Assistant:

void onConnect(int fd) {
	printf("onConnect\n");
	std::string msg = std::string(packetSize,'a');
	auto buff = Buffer::New(msg);
	auto sc = TCPSocket::New(&poller_,fd);
	sc->SetRecvCallback(onDataClient)->SetErrorCallback(onError);
	sc->SetFlushCallback([buff](const TCPSocket::Ptr &s){
		s->Recv(buff);
	});
	sc->Start();
	sc->Send(buff);
}